

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TArray<FICastSound,_FICastSound>::Resize(TArray<FICastSound,_FICastSound> *this,uint amount)

{
  uint uVar1;
  FICastSound *pFVar2;
  ulong uVar3;
  
  uVar1 = this->Count;
  if (amount < uVar1 || amount - uVar1 == 0) {
    if (amount != 0 && uVar1 == 0) {
      __assert_fail("last != ~0u",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./tarray.h"
                    ,0x1ad,
                    "void TArray<FICastSound>::DoDelete(unsigned int, unsigned int) [T = FICastSound, TT = FICastSound]"
                   );
    }
  }
  else {
    Grow(this,amount - uVar1);
    uVar3 = (ulong)this->Count;
    if (this->Count < amount) {
      pFVar2 = this->Array;
      do {
        pFVar2[uVar3].mSound.ID = 0;
        uVar3 = uVar3 + 1;
      } while (amount != uVar3);
    }
  }
  this->Count = amount;
  return;
}

Assistant:

void Resize (unsigned int amount)
	{
		if (Count < amount)
		{
			// Adding new entries
			Grow (amount - Count);
			for (unsigned int i = Count; i < amount; ++i)
			{
				::new((void *)&Array[i]) T;
			}
		}
		else if (Count != amount)
		{
			// Deleting old entries
			DoDelete (amount, Count - 1);
		}
		Count = amount;
	}